

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_util.cpp
# Opt level: O0

char BmsUtil::CharacterToNumber(char c)

{
  char local_9;
  char c_local;
  
  switch(c) {
  case '0':
    local_9 = '\0';
    break;
  case '1':
    local_9 = '\x01';
    break;
  case '2':
    local_9 = '\x02';
    break;
  case '3':
    local_9 = '\x03';
    break;
  case '4':
    local_9 = '\x04';
    break;
  case '5':
    local_9 = '\x05';
    break;
  case '6':
    local_9 = '\x06';
    break;
  case '7':
    local_9 = '\a';
    break;
  case '8':
    local_9 = '\b';
    break;
  case '9':
    local_9 = '\t';
    break;
  default:
    local_9 = -1;
    break;
  case 'A':
  case 'a':
    local_9 = '\n';
    break;
  case 'B':
  case 'b':
    local_9 = '\v';
    break;
  case 'C':
  case 'c':
    local_9 = '\f';
    break;
  case 'D':
  case 'd':
    local_9 = '\r';
    break;
  case 'E':
  case 'e':
    local_9 = '\x0e';
    break;
  case 'F':
  case 'f':
    local_9 = '\x0f';
    break;
  case 'G':
  case 'g':
    local_9 = '\x10';
    break;
  case 'H':
  case 'h':
    local_9 = '\x11';
    break;
  case 'I':
  case 'i':
    local_9 = '\x12';
    break;
  case 'J':
  case 'j':
    local_9 = '\x13';
    break;
  case 'K':
  case 'k':
    local_9 = '\x14';
    break;
  case 'L':
  case 'l':
    local_9 = '\x15';
    break;
  case 'M':
  case 'm':
    local_9 = '\x16';
    break;
  case 'N':
  case 'n':
    local_9 = '\x17';
    break;
  case 'O':
  case 'o':
    local_9 = '\x18';
    break;
  case 'P':
  case 'p':
    local_9 = '\x19';
    break;
  case 'Q':
  case 'q':
    local_9 = '\x1a';
    break;
  case 'R':
  case 'r':
    local_9 = '\x1b';
    break;
  case 'S':
  case 's':
    local_9 = '\x1c';
    break;
  case 'T':
  case 't':
    local_9 = '\x1d';
    break;
  case 'U':
  case 'u':
    local_9 = '\x1e';
    break;
  case 'V':
  case 'v':
    local_9 = '\x1f';
    break;
  case 'W':
  case 'w':
    local_9 = ' ';
    break;
  case 'X':
  case 'x':
    local_9 = '!';
    break;
  case 'Y':
  case 'y':
    local_9 = '\"';
    break;
  case 'Z':
  case 'z':
    local_9 = '#';
  }
  return local_9;
}

Assistant:

char
BmsUtil::CharacterToNumber(char c)
{
	switch (c) {
	case '0':           return 0;
	case '1':           return 1;
	case '2':           return 2;
	case '3':           return 3;
	case '4':           return 4;
	case '5':           return 5;
	case '6':           return 6;
	case '7':           return 7;
	case '8':           return 8;
	case '9':           return 9;
	case 'a': case 'A': return 10;
	case 'b': case 'B': return 11;
	case 'c': case 'C': return 12;
	case 'd': case 'D': return 13;
	case 'e': case 'E': return 14;
	case 'f': case 'F': return 15;
	case 'g': case 'G': return 16;
	case 'h': case 'H': return 17;
	case 'i': case 'I': return 18;
	case 'j': case 'J': return 19;
	case 'k': case 'K': return 20;
	case 'l': case 'L': return 21;
	case 'm': case 'M': return 22;
	case 'n': case 'N': return 23;
	case 'o': case 'O': return 24;
	case 'p': case 'P': return 25;
	case 'q': case 'Q': return 26;
	case 'r': case 'R': return 27;
	case 's': case 'S': return 28;
	case 't': case 'T': return 29;
	case 'u': case 'U': return 30;
	case 'v': case 'V': return 31;
	case 'w': case 'W': return 32;
	case 'x': case 'X': return 33;
	case 'y': case 'Y': return 34;
	case 'z': case 'Z': return 35;
	default:            return -1;
	}
}